

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ripser.cpp
# Opt level: O0

index_t get_next_vertex(index_t *v,index_t idx,index_t k,binomial_coeff_table *binomial_coeff)

{
  index_t iVar1;
  int n;
  int iVar2;
  int in_ESI;
  int *in_RDI;
  index_t step;
  index_t i;
  index_t count;
  index_t in_stack_ffffffffffffffd8;
  index_t in_stack_ffffffffffffffdc;
  undefined4 in_stack_ffffffffffffffe0;
  undefined4 in_stack_ffffffffffffffe4;
  int iVar3;
  
  iVar1 = binomial_coeff_table::operator()
                    ((binomial_coeff_table *)
                     CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0),
                     in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8);
  if (in_ESI < iVar1) {
    n = *in_RDI;
    while (iVar3 = n, 0 < iVar3) {
      n = iVar3 >> 1;
      iVar2 = *in_RDI - n;
      iVar1 = binomial_coeff_table::operator()
                        ((binomial_coeff_table *)CONCAT44(iVar3,iVar2),n,in_stack_ffffffffffffffd8);
      if (in_ESI < iVar1) {
        *in_RDI = iVar2 + -1;
        n = iVar3 - (n + 1);
      }
    }
  }
  return *in_RDI;
}

Assistant:

index_t get_next_vertex(index_t& v, const index_t idx, const index_t k, const binomial_coeff_table& binomial_coeff) {
	if (binomial_coeff(v, k) > idx) {
		index_t count = v;
		while (count > 0) {
			index_t i = v;
			index_t step = count >> 1;
			i -= step;
			if (binomial_coeff(i, k) > idx) {
				v = --i;
				count -= step + 1;
			} else
				count = step;
		}
	}
	assert(binomial_coeff(v, k) <= idx);
	assert(binomial_coeff(v + 1, k) > idx);
	return v;
}